

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
          (DelayedCloseWebSocket *this,WebSocket *other)

{
  WebSocket *pWVar1;
  undefined8 in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  WebSocket *local_38;
  Promise<void> local_30;
  undefined8 local_20;
  WebSocket *other_local;
  DelayedCloseWebSocket *this_local;
  
  local_20 = in_RDX;
  other_local = other;
  this_local = this;
  pWVar1 = Own<kj::WebSocket>::operator->((Own<kj::WebSocket> *)(other + 1));
  (*pWVar1->_vptr_WebSocket[7])(&local_30,pWVar1,local_20);
  local_38 = other;
  Promise<void>::
  then<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::pumpTo(kj::WebSocket&)::_lambda()_1_,kj::_::PropagateException>
            ((Promise<void> *)this,(Type *)&local_30,(PropagateException *)&local_38);
  Promise<void>::~Promise(&local_30);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
      return inner->pumpTo(other).then([this]() {
        return afterReceiveClosed();
      });
    }